

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_move_fr_usp(m68k_info *info)

{
  cs_m68k *pcVar1;
  long in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  m68k_info *in_stack_fffffffffffffff0;
  
  pcVar1 = build_init_op(in_stack_fffffffffffffff0,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                         (int)in_stack_ffffffffffffffe8,
                         (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  pcVar1->operands[0].address_mode = M68K_AM_NONE;
  pcVar1->operands[0].field_0.simm = 4.2039e-44;
  pcVar1->operands[1].address_mode = M68K_AM_NONE;
  pcVar1->operands[1].field_0.reg = (*(uint *)(in_RDI + 0x24) & 7) + M68K_REG_A0;
  return;
}

Assistant:

static void d68000_move_fr_usp(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVE, 2, 0);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_NONE;
	op0->reg = M68K_REG_USP;

	op1->address_mode = M68K_AM_NONE;
	op1->reg = M68K_REG_A0 + (info->ir & 7);
}